

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

int __thiscall glu::ShaderProgram::init(ShaderProgram *this,EVP_PKEY_CTX *ctx)

{
  Program *this_00;
  long *plVar1;
  vector<glu::Shader*,std::allocator<glu::Shader*>> *this_01;
  byte bVar2;
  GLenum GVar3;
  int iVar4;
  Shader *this_02;
  pointer ppSVar5;
  long in_RDX;
  char *__to;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  GLsizei GVar6;
  char *__from;
  long lVar7;
  int shaderType;
  long lVar8;
  int shaderType_1;
  long lVar9;
  undefined8 *puVar10;
  int length;
  char *source;
  int local_6c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_68;
  long local_50;
  long local_48;
  Shader *local_40;
  Functions *local_38;
  
  bVar2 = 1;
  lVar7 = 0;
  local_50 = in_RDX;
  local_38 = (Functions *)ctx;
  do {
    lVar9 = *(long *)(local_50 + lVar7 * 0x18);
    __from = (char *)((ulong)(*(long *)(local_50 + 8 + lVar7 * 0x18) - lVar9) >> 5);
    local_48 = lVar7;
    if (0 < (int)__from) {
      plVar1 = (long *)(local_50 + lVar7 * 0x18);
      this_01 = (vector<glu::Shader*,std::allocator<glu::Shader*>> *)(this->m_shaders + lVar7);
      lVar7 = 8;
      lVar8 = 0;
      do {
        local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar9 + -8 + lVar7);
        local_6c = *(int *)(lVar9 + lVar7);
        std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::reserve
                  ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)this_01,
                   (*(long *)(this_01 + 8) - *(long *)this_01 >> 3) + 1);
        this_02 = (Shader *)operator_new(0x68);
        Shader::Shader(this_02,local_38,(ShaderType)local_48);
        local_40 = this_02;
        std::vector<glu::Shader*,std::allocator<glu::Shader*>>::emplace_back<glu::Shader*>
                  (this_01,&local_40);
        __from = (char *)0x1;
        Shader::setSources(*(Shader **)(*(long *)(this_01 + 8) + -8),1,(char **)&local_68,&local_6c)
        ;
        Shader::compile(*(Shader **)(*(long *)(this_01 + 8) + -8));
        if ((bVar2 & 1) == 0) {
          bVar2 = 0;
        }
        else {
          bVar2 = *(byte *)(*(long *)(*(long *)(this_01 + 8) + -8) + 0x58);
        }
        lVar8 = lVar8 + 1;
        lVar9 = *plVar1;
        lVar7 = lVar7 + 0x20;
      } while (lVar8 < (int)((ulong)(plVar1[1] - lVar9) >> 5));
    }
    lVar7 = local_48 + 1;
  } while (lVar7 != 6);
  iVar4 = 6;
  if ((bVar2 & 1) != 0) {
    this_00 = &this->m_program;
    lVar7 = 0;
    do {
      ppSVar5 = this->m_shaders[lVar7].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      __to = (char *)((ulong)((long)this->m_shaders[lVar7].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5) >> 3
                     );
      if (0 < (int)__to) {
        lVar9 = 0;
        do {
          (*((this->m_program).m_gl)->attachShader)
                    ((this->m_program).m_program,ppSVar5[lVar9]->m_shader);
          GVar3 = (*this_00->m_gl->getError)();
          __from = "glAttachShader()";
          checkError(GVar3,"glAttachShader()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
                     ,0xcf);
          lVar9 = lVar9 + 1;
          ppSVar5 = this->m_shaders[lVar7].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __to = extraout_RDX;
        } while (lVar9 < (int)((ulong)((long)this->m_shaders[lVar7].
                                             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppSVar5) >> 3));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    puVar10 = *(undefined8 **)(local_50 + 0x90);
    if (puVar10 != *(undefined8 **)(local_50 + 0x98)) {
      do {
        (*((this->m_program).m_gl)->bindAttribLocation)
                  ((this->m_program).m_program,*(GLuint *)(puVar10 + 4),(GLchar *)*puVar10);
        GVar3 = (*this_00->m_gl->getError)();
        __from = "glBindAttribLocation()";
        checkError(GVar3,"glBindAttribLocation()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
                   ,0xdb);
        puVar10 = puVar10 + 5;
        __to = extraout_RDX_00;
      } while (puVar10 != *(undefined8 **)(local_50 + 0x98));
    }
    if (*(int *)(local_50 + 0xa8) != 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_68,*(long *)(local_50 + 0xb8) - *(long *)(local_50 + 0xb0) >> 5,
                 (allocator_type *)&local_40);
      GVar6 = (GLsizei)((ulong)((long)local_68.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (0 < GVar6) {
        lVar7 = 0;
        lVar9 = 0;
        do {
          *(undefined8 *)
           ((long)local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar7) =
               *(undefined8 *)(*(long *)(local_50 + 0xb0) + lVar7 * 4);
          lVar9 = lVar9 + 1;
          GVar6 = (GLsizei)((ulong)((long)local_68.
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar7 = lVar7 + 8;
        } while (lVar9 < GVar6);
      }
      (*((this->m_program).m_gl)->transformFeedbackVaryings)
                ((this->m_program).m_program,GVar6,
                 local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start,*(GLenum *)(local_50 + 0xa8));
      GVar3 = (*this_00->m_gl->getError)();
      __from = "glTransformFeedbackVaryings()";
      checkError(GVar3,"glTransformFeedbackVaryings()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
                 ,0xe1);
      __to = extraout_RDX_01;
      if (local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (GLchar **)0x0) {
        __from = (char *)((long)local_68.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_68.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_68.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)__from);
        __to = extraout_RDX_02;
      }
    }
    if (*(char *)(local_50 + 200) == '\x01') {
      (*((this->m_program).m_gl)->programParameteri)((this->m_program).m_program,0x8258,1);
      GVar3 = (*this_00->m_gl->getError)();
      __from = "glProgramParameteri()";
      checkError(GVar3,"glProgramParameteri()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
                 ,0x102);
      __to = extraout_RDX_03;
    }
    iVar4 = Program::link(this_00,__from,__to);
  }
  return iVar4;
}

Assistant:

void ShaderProgram::init (const glw::Functions& gl, const ProgramSources& sources)
{
	try
	{
		bool shadersOk = true;

		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		{
			for (int shaderNdx = 0; shaderNdx < (int)sources.sources[shaderType].size(); ++shaderNdx)
			{
				const char* source	= sources.sources[shaderType][shaderNdx].c_str();
				const int	length	= (int)sources.sources[shaderType][shaderNdx].size();

				m_shaders[shaderType].reserve(m_shaders[shaderType].size() + 1);

				m_shaders[shaderType].push_back(new Shader(gl, ShaderType(shaderType)));
				m_shaders[shaderType].back()->setSources(1, &source, &length);
				m_shaders[shaderType].back()->compile();

				shadersOk = shadersOk && m_shaders[shaderType].back()->getCompileStatus();
			}
		}

		if (shadersOk)
		{
			for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
				for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
					m_program.attachShader(m_shaders[shaderType][shaderNdx]->getShader());

			for (std::vector<AttribLocationBinding>::const_iterator binding = sources.attribLocationBindings.begin(); binding != sources.attribLocationBindings.end(); ++binding)
				m_program.bindAttribLocation(binding->location, binding->name.c_str());

			DE_ASSERT((sources.transformFeedbackBufferMode == GL_NONE) == sources.transformFeedbackVaryings.empty());
			if (sources.transformFeedbackBufferMode != GL_NONE)
			{
				std::vector<const char*> tfVaryings(sources.transformFeedbackVaryings.size());
				for (int ndx = 0; ndx < (int)tfVaryings.size(); ndx++)
					tfVaryings[ndx] = sources.transformFeedbackVaryings[ndx].c_str();

				m_program.transformFeedbackVaryings((int)tfVaryings.size(), &tfVaryings[0], sources.transformFeedbackBufferMode);
			}

			if (sources.separable)
				m_program.setSeparable(true);

			m_program.link();
		}
	}
	catch (...)
	{
		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
			for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
				delete m_shaders[shaderType][shaderNdx];
		throw;
	}
}